

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfgs.cc
# Opt level: O0

void preconditioner_to_regularizer<dense_parameters>
               (vw *all,bfgs *b,float regularization,dense_parameters *weights)

{
  bool bVar1;
  uint32_t uVar2;
  float *pfVar3;
  undefined8 uVar4;
  char *pcVar5;
  int __c;
  int __c_00;
  int __c_01;
  dense_parameters *in_RDX;
  ulong uVar6;
  long in_RSI;
  dense_iterator<float> *pdVar7;
  undefined4 in_XMM0_Da;
  float fVar8;
  iterator w_2;
  iterator w_1;
  uint64_t i;
  iterator w;
  stringstream __msg;
  uint32_t length;
  dense_parameters *in_stack_fffffffffffffd50;
  string *in_stack_fffffffffffffd58;
  int in_stack_fffffffffffffd64;
  char *in_stack_fffffffffffffd68;
  long lVar9;
  vw_exception *in_stack_fffffffffffffd70;
  dense_iterator<float> local_280;
  dense_iterator<float> local_268;
  dense_iterator<float> local_250;
  dense_iterator<float> local_238;
  ulong local_220;
  dense_iterator<float> local_218;
  dense_iterator<float> local_200;
  undefined1 local_1e1;
  stringstream local_1b0 [16];
  stringstream local_1a0 [168];
  size_t in_stack_ffffffffffffff08;
  
  if (*(long *)(in_RSI + 0xd8) == 0) {
    pfVar3 = calloc_or_throw<float>(in_stack_ffffffffffffff08);
    *(float **)(in_RSI + 0xd8) = pfVar3;
    if (*(long *)(in_RSI + 0xd8) == 0) {
      std::__cxx11::stringstream::stringstream(local_1b0);
      std::operator<<((ostream *)(local_1b0 + 0x10),
                      "Failed to allocate weight array: try decreasing -b <bits>");
      local_1e1 = 1;
      uVar4 = __cxa_allocate_exception(0x38);
      std::__cxx11::stringstream::str();
      VW::vw_exception::vw_exception
                (in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,in_stack_fffffffffffffd64,
                 in_stack_fffffffffffffd58);
      local_1e1 = 0;
      __cxa_throw(uVar4,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    dense_parameters::begin(in_stack_fffffffffffffd50);
    while( true ) {
      dense_parameters::end(in_stack_fffffffffffffd50);
      pdVar7 = &local_218;
      bVar1 = dense_iterator<float>::operator!=(&local_200,pdVar7);
      if (!bVar1) break;
      pcVar5 = dense_iterator<float>::index(&local_200,(char *)pdVar7,__c);
      uVar2 = dense_parameters::stride_shift(in_RDX);
      local_220 = (ulong)pcVar5 >> ((byte)uVar2 & 0x3f);
      *(undefined4 *)(*(long *)(in_RSI + 0xd8) + local_220 * 8) = in_XMM0_Da;
      pfVar3 = dense_iterator<float>::operator*(&local_200);
      if (0.0 < pfVar3[3]) {
        pfVar3 = dense_iterator<float>::operator*(&local_200);
        *(float *)(*(long *)(in_RSI + 0xd8) + local_220 * 8) =
             1.0 / pfVar3[3] + *(float *)(*(long *)(in_RSI + 0xd8) + local_220 * 8);
      }
      dense_iterator<float>::operator++(&local_200);
    }
  }
  else {
    dense_parameters::begin(in_stack_fffffffffffffd50);
    while( true ) {
      dense_parameters::end(in_stack_fffffffffffffd50);
      pdVar7 = &local_250;
      bVar1 = dense_iterator<float>::operator!=(&local_238,pdVar7);
      if (!bVar1) break;
      pfVar3 = dense_iterator<float>::operator*(&local_238);
      if (0.0 < pfVar3[3]) {
        pfVar3 = dense_iterator<float>::operator*(&local_238);
        fVar8 = 1.0 / pfVar3[3];
        lVar9 = *(long *)(in_RSI + 0xd8);
        pcVar5 = dense_iterator<float>::index(&local_238,(char *)pdVar7,__c_00);
        uVar2 = dense_parameters::stride_shift(in_RDX);
        uVar6 = (ulong)pcVar5 >> ((byte)uVar2 & 0x3f);
        *(float *)(lVar9 + uVar6 * 8) = fVar8 + *(float *)(lVar9 + uVar6 * 8);
      }
      dense_iterator<float>::operator++(&local_238);
    }
  }
  dense_parameters::begin(in_stack_fffffffffffffd50);
  while( true ) {
    dense_parameters::end(in_stack_fffffffffffffd50);
    pdVar7 = &local_280;
    bVar1 = dense_iterator<float>::operator!=(&local_268,pdVar7);
    if (!bVar1) break;
    pfVar3 = dense_iterator<float>::operator*(&local_268);
    fVar8 = *pfVar3;
    in_stack_fffffffffffffd50 = *(dense_parameters **)(in_RSI + 0xd8);
    pcVar5 = dense_iterator<float>::index(&local_268,(char *)pdVar7,__c_01);
    uVar2 = dense_parameters::stride_shift(in_RDX);
    *(float *)((long)&in_stack_fffffffffffffd50->_begin +
              ((ulong)pcVar5 >> ((byte)uVar2 & 0x3f)) * 8 + 4) = fVar8;
    dense_iterator<float>::operator++(&local_268);
  }
  return;
}

Assistant:

void preconditioner_to_regularizer(vw& all, bfgs& b, float regularization, T& weights)
{
  uint32_t length = 1 << all.num_bits;

  if (b.regularizers == nullptr)
  {
    b.regularizers = calloc_or_throw<weight>(2 * length);

    if (b.regularizers == nullptr)
      THROW("Failed to allocate weight array: try decreasing -b <bits>");

    for (typename T::iterator w = weights.begin(); w != weights.end(); ++w)
    {
      uint64_t i = w.index() >> weights.stride_shift();
      b.regularizers[2 * i] = regularization;
      if ((&(*w))[W_COND] > 0.f)
        b.regularizers[2 * i] += 1.f / (&(*w))[W_COND];
    }
  }
  else
    for (typename T::iterator w = weights.begin(); w != weights.end(); ++w)
    {
      if ((&(*w))[W_COND] > 0.f)
        b.regularizers[2 * (w.index() >> weights.stride_shift())] += 1.f / (&(*w))[W_COND];
    }

  for (typename T::iterator w = weights.begin(); w != weights.end(); ++w)
    b.regularizers[2 * (w.index() >> weights.stride_shift()) + 1] = *w;
}